

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                *matrix,map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  Column_support *other_node;
  ID_index IVar2;
  _Rb_tree_color _Var3;
  int iVar4;
  pointer pIVar5;
  _Base_ptr p_Var6;
  node_ptr plVar7;
  node_ptr *pplVar8;
  Index IVar9;
  Field_operators *pFVar10;
  Entry_constructor *pEVar11;
  bool bVar12;
  node_ptr to_erase;
  reference value;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
  *this;
  _Rb_tree_node_base *p_Var13;
  long lVar14;
  const_node_ptr p;
  Column_support *pCVar15;
  node_ptr plVar16;
  long *plVar17;
  undefined4 local_284;
  undefined *local_280;
  undefined4 *local_278;
  undefined **local_270;
  undefined **local_268;
  char *local_260;
  shared_count sStack_258;
  char *local_250;
  undefined **local_248;
  ulong local_240;
  shared_count sStack_238;
  undefined4 **local_230;
  Delete_disposer local_228;
  undefined1 local_220;
  undefined8 *local_218;
  undefined ***local_210;
  char *local_208;
  char *local_200;
  shared_count sStack_1f8;
  undefined4 **local_1f0;
  char *local_1e8;
  map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
  *local_1e0;
  Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  col;
  Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  moveCol;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_1e0 = rows;
  build_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&col,(vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&col);
  build_column_values<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&col,(vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&col);
  pIVar5 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  col.super_Row_access_option.columnIndex_ = 6;
  col.super_Row_access_option.rows_ = local_1e0;
  col.operators_ = pIVar5->operators_;
  col.entryPool_ = pIVar5->entryPool_;
  other_node = &col.column_;
  plVar17 = *(long **)&(pIVar5->column_).super_type.data_.root_plus_size_;
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)other_node;
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)other_node;
  if ((Column_support *)plVar17 != &pIVar5->column_) {
    do {
      IVar2 = *(ID_index *)(plVar17 + 2);
      value = (reference)operator_new(0x30);
      (value->super_Entry_column_index_option).columnIndex_ =
           col.super_Row_access_option.columnIndex_;
      (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0
      ;
      (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0
      ;
      (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
      (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
      value->rowIndex_ = IVar2;
      if ((value->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
          (node_ptr)0x0) {
        __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                      "/usr/include/boost/intrusive/list.hpp",0x33c,
                      "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
                     );
      }
      (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
           col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
      (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)other_node;
      pplVar8 = &(col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_)->next_;
      col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           (node_ptr)&value->super_Column_hook;
      *pplVar8 = (node_ptr)&value->super_Column_hook;
      moveCol.super_Row_access_option.columnIndex_ = IVar2;
      if (col.super_Row_access_option.rows_ != (Row_container *)0x0) {
        this = &std::
                map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                ::operator[](col.super_Row_access_option.rows_,(key_type *)&moveCol)->super_type;
        boost::intrusive::
        list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
        ::push_back(this,value);
      }
      plVar17 = (long *)*plVar17;
    } while ((Column_support *)plVar17 != &pIVar5->column_);
  }
  p_Var1 = &(local_1e0->_M_t)._M_impl.super__Rb_tree_header;
  p_Var13 = (local_1e0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  IVar9 = col.super_Row_access_option.columnIndex_;
  pFVar10 = col.operators_;
  pEVar11 = col.entryPool_;
  while ((_Rb_tree_header *)p_Var13 != p_Var1) {
    col.super_Row_access_option.columnIndex_ = IVar9;
    col.operators_ = pFVar10;
    col.entryPool_ = pEVar11;
    if (p_Var13[1]._M_parent != (_Base_ptr)&p_Var13[1]._M_parent &&
        p_Var13[1]._M_parent != (_Base_ptr)0x0) {
      p_Var6 = p_Var13[1]._M_left;
      _Var3 = p_Var6[1]._M_color;
      if ((_Var3 < 6) && ((0x2bU >> (_Var3 & 0x1f) & 1) != 0)) {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x20d);
        local_240 = local_240 & 0xffffffffffffff00;
        local_248 = &PTR__lazy_ostream_0020d440;
        sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_230 = (undefined4 **)0x1cf1b2;
        iVar4 = *(int *)&p_Var6[-1]._M_right;
        local_278 = (undefined4 *)CONCAT44(local_278._4_4_,iVar4);
        local_280 = (undefined *)CONCAT44(local_280._4_4_,6);
        local_268 = (undefined **)CONCAT71(local_268._1_7_,iVar4 == 6);
        local_260 = (char *)0x0;
        sStack_258.pi_ = (sp_counted_base *)0x0;
        local_208 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_200 = "";
        local_1f0 = &local_278;
        moveCol.super_Row_access_option.rows_ =
             (Row_container *)((ulong)moveCol.super_Row_access_option.rows_ & 0xffffffffffffff00);
        moveCol.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0020d940;
        moveCol.operators_ = (Field_operators *)&boost::unit_test::lazy_ostream::inst;
        moveCol.entryPool_ = (Entry_constructor *)&local_1f0;
        local_270 = &local_280;
        local_220 = 0;
        local_228.col_ =
             (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
              *)&PTR__lazy_ostream_0020d6c0;
        local_218 = &boost::unit_test::lazy_ostream::inst;
        local_210 = &local_270;
        boost::test_tools::tt_detail::report_assertion
                  (&local_268,&local_248,&local_208,0x20d,1,2,2,"entry.get_column_index()",&moveCol,
                   "6",&local_228);
        boost::detail::shared_count::~shared_count(&sStack_258);
      }
    }
    p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    IVar9 = col.super_Row_access_option.columnIndex_;
    pFVar10 = col.operators_;
    pEVar11 = col.entryPool_;
  }
  col.super_Row_access_option.columnIndex_ = 0;
  moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)&moveCol.column_;
  moveCol.super_Row_access_option.columnIndex_ = IVar9;
  col.operators_ = (Field_operators *)0x0;
  col.entryPool_ = (Entry_constructor *)0x0;
  moveCol.super_Row_access_option.rows_ = col.super_Row_access_option.rows_;
  moveCol.operators_ = pFVar10;
  moveCol.entryPool_ = pEVar11;
  moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
       moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes(moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_,
             (node_ptr)other_node);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
  local_268 = &PTR__lazy_ostream_0020d440;
  sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_280 = (undefined *)0xffffffffffffffff;
  plVar16 = (node_ptr)&moveCol.column_;
  do {
    plVar16 = (((type *)&plVar16->next_)->data_).root_plus_size_.m_header.super_node.next_;
    local_280 = local_280 + 1;
  } while (plVar16 != (node_ptr)&moveCol.column_);
  local_270 = &local_280;
  local_278 = &local_284;
  local_284 = 4;
  local_200 = (char *)0x0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (undefined4 **)0x1cfc79;
  local_1e8 = "";
  local_210 = &local_270;
  local_220 = 0;
  local_228.col_ =
       (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_0020d400;
  local_218 = &boost::unit_test::lazy_ostream::inst;
  local_230 = &local_278;
  local_240 = local_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_0020d6c0;
  sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_208._0_1_ = local_280 == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_268,&local_1f0,0x21c,1,2,2,"moveCol.size()",&local_228,"4",&local_248
            );
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
  local_268 = &PTR__lazy_ostream_0020d440;
  sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  lVar14 = 1;
  pCVar15 = other_node;
  do {
    pCVar15 = (Column_support *)
              (pCVar15->super_type).data_.root_plus_size_.m_header.super_node.next_;
    lVar14 = lVar14 + -1;
  } while (pCVar15 != other_node);
  local_280 = (undefined *)-lVar14;
  local_284 = 0;
  local_208 = (char *)CONCAT71(local_208._1_7_,lVar14 == 0);
  local_200 = (char *)0x0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (undefined4 **)0x1cfc79;
  local_1e8 = "";
  local_270 = &local_280;
  local_220 = 0;
  local_228.col_ =
       (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_0020d400;
  local_218 = &boost::unit_test::lazy_ostream::inst;
  local_210 = &local_270;
  local_278 = &local_284;
  local_240 = local_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_0020d6c0;
  sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_230 = &local_278;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_268,&local_1f0,0x21d,1,2,2,"col.size()",&local_228,"0",&local_248);
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar12 = Gudhi::persistence_matrix::operator==
                     ((matrix->
                      super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,&moveCol);
  local_248 = (undefined **)CONCAT71(local_248._1_7_,bVar12);
  local_240 = 0;
  sStack_238.pi_ = (sp_counted_base *)0x0;
  local_268 = (undefined **)0x1d9dec;
  local_260 = "";
  local_220 = 0;
  local_228.col_ =
       (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_0020d388;
  local_218 = &boost::unit_test::lazy_ostream::inst;
  local_210 = &local_268;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_238);
  for (p_Var13 = (local_1e0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != p_Var1;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    if (p_Var13[1]._M_parent != (_Base_ptr)&p_Var13[1]._M_parent &&
        p_Var13[1]._M_parent != (_Base_ptr)0x0) {
      p_Var6 = p_Var13[1]._M_left;
      _Var3 = p_Var6[1]._M_color;
      if ((_Var3 < 6) && ((0x2bU >> (_Var3 & 0x1f) & 1) != 0)) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x225,
                   &local_150);
        local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
        local_268 = &PTR__lazy_ostream_0020d440;
        sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_250 = "";
        iVar4 = *(int *)&p_Var6[-1]._M_right;
        local_280 = (undefined *)CONCAT44(local_280._4_4_,iVar4);
        local_284 = 6;
        local_208 = (char *)CONCAT71(local_208._1_7_,iVar4 == 6);
        local_200 = (char *)0x0;
        sStack_1f8.pi_ = (sp_counted_base *)0x0;
        local_1f0 = (undefined4 **)0x1cfc79;
        local_1e8 = "";
        local_270 = &local_280;
        local_220 = 0;
        local_228.col_ =
             (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
              *)&PTR__lazy_ostream_0020d940;
        local_218 = &boost::unit_test::lazy_ostream::inst;
        local_210 = &local_270;
        local_278 = &local_284;
        local_240 = local_240 & 0xffffffffffffff00;
        local_248 = &PTR__lazy_ostream_0020d6c0;
        sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_230 = &local_278;
        boost::test_tools::tt_detail::report_assertion
                  (&local_208,&local_268,&local_1f0,0x225,1,2,2,"entry.get_column_index()",
                   &local_228,"6",&local_248);
        boost::detail::shared_count::~shared_count(&sStack_1f8);
      }
    }
  }
  Gudhi::persistence_matrix::swap(&col,&moveCol);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
  local_268 = &PTR__lazy_ostream_0020d440;
  sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  lVar14 = 1;
  plVar16 = (node_ptr)&moveCol.column_;
  do {
    plVar16 = (((type *)&plVar16->next_)->data_).root_plus_size_.m_header.super_node.next_;
    lVar14 = lVar14 + -1;
  } while (plVar16 != (node_ptr)&moveCol.column_);
  local_280 = (undefined *)-lVar14;
  local_284 = 0;
  local_200 = (char *)0x0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (undefined4 **)0x1cfc79;
  local_1e8 = "";
  local_270 = &local_280;
  local_220 = 0;
  local_228.col_ =
       (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_0020d400;
  local_218 = &boost::unit_test::lazy_ostream::inst;
  local_210 = &local_270;
  local_278 = &local_284;
  local_240 = local_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_0020d6c0;
  sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_230 = &local_278;
  local_208._0_1_ = lVar14 == 0;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_268,&local_1f0,0x234,1,2,2,"moveCol.size()",&local_228,"0",&local_248
            );
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
  local_268 = &PTR__lazy_ostream_0020d440;
  sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_280 = (undefined *)0xffffffffffffffff;
  plVar16 = (node_ptr)&col.column_;
  do {
    plVar16 = (((type *)&plVar16->next_)->data_).root_plus_size_.m_header.super_node.next_;
    local_280 = local_280 + 1;
  } while (plVar16 != (node_ptr)&col.column_);
  local_284 = 4;
  local_208 = (char *)CONCAT71(local_208._1_7_,local_280 == (undefined *)0x4);
  local_200 = (char *)0x0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (undefined4 **)0x1cfc79;
  local_1e8 = "";
  local_270 = &local_280;
  local_220 = 0;
  local_228.col_ =
       (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_0020d400;
  local_218 = &boost::unit_test::lazy_ostream::inst;
  local_210 = &local_270;
  local_278 = &local_284;
  local_240 = local_240 & 0xffffffffffffff00;
  local_248 = &PTR__lazy_ostream_0020d6c0;
  sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_230 = &local_278;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_268,&local_1f0,0x235,1,2,2,"col.size()",&local_228,"4",&local_248);
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar12 = Gudhi::persistence_matrix::operator==
                     ((matrix->
                      super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,&col);
  local_248 = (undefined **)CONCAT71(local_248._1_7_,bVar12);
  local_240 = 0;
  sStack_238.pi_ = (sp_counted_base *)0x0;
  local_268 = (undefined **)0x1d9e01;
  local_260 = "";
  local_220 = 0;
  local_228.col_ =
       (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_0020d388;
  local_218 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_210 = &local_268;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_238);
  for (p_Var13 = (local_1e0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != p_Var1;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    if (p_Var13[1]._M_parent != (_Base_ptr)&p_Var13[1]._M_parent &&
        p_Var13[1]._M_parent != (_Base_ptr)0x0) {
      p_Var6 = p_Var13[1]._M_left;
      _Var3 = p_Var6[1]._M_color;
      if ((_Var3 < 6) && ((0x2bU >> (_Var3 & 0x1f) & 1) != 0)) {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x23d,
                   &local_170);
        local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
        local_268 = &PTR__lazy_ostream_0020d440;
        sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_250 = "";
        iVar4 = *(int *)&p_Var6[-1]._M_right;
        local_280 = (undefined *)CONCAT44(local_280._4_4_,iVar4);
        local_284 = 6;
        local_208 = (char *)CONCAT71(local_208._1_7_,iVar4 == 6);
        local_200 = (char *)0x0;
        sStack_1f8.pi_ = (sp_counted_base *)0x0;
        local_1f0 = (undefined4 **)0x1cfc79;
        local_1e8 = "";
        local_270 = &local_280;
        local_220 = 0;
        local_228.col_ =
             (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
              *)&PTR__lazy_ostream_0020d940;
        local_218 = &boost::unit_test::lazy_ostream::inst;
        local_210 = &local_270;
        local_278 = &local_284;
        local_240 = local_240 & 0xffffffffffffff00;
        local_248 = &PTR__lazy_ostream_0020d6c0;
        sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_230 = &local_278;
        boost::test_tools::tt_detail::report_assertion
                  (&local_208,&local_268,&local_1f0,0x23d,1,2,2,"entry.get_column_index()",
                   &local_228,"6",&local_248);
        boost::detail::shared_count::~shared_count(&sStack_1f8);
      }
    }
  }
  local_228.col_ = &moveCol;
  if (moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
      (node_ptr)&moveCol.column_) {
    plVar16 = moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
    do {
      plVar7 = plVar16->next_;
      plVar16->next_ = (node_ptr)0x0;
      plVar16->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
      ::Delete_disposer::operator()(&local_228,(Entry *)&plVar16[-2].prev_);
      plVar16 = plVar7;
    } while (plVar7 != (node_ptr)&moveCol.column_);
  }
  moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  moveCol.super_Row_access_option._0_8_ = &col;
  if (col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
      (node_ptr)&col.column_) {
    plVar16 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
    do {
      plVar7 = plVar16->next_;
      plVar16->next_ = (node_ptr)0x0;
      plVar16->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
      ::Delete_disposer::operator()((Delete_disposer *)&moveCol,(Entry *)&plVar16[-2].prev_);
      plVar16 = plVar7;
    } while (plVar7 != (node_ptr)&col.column_);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}